

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Value::set_allocated_blobfilevalue
          (Value *this,Value_BlobFileValue *blobfilevalue)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (blobfilevalue != (Value_BlobFileValue *)0x0) {
    submessage_arena =
         google::protobuf::internal::InternalMetadata::owning_arena
                   (&(blobfilevalue->super_MessageLite)._internal_metadata_);
    if (message_arena != submessage_arena) {
      blobfilevalue =
           (Value_BlobFileValue *)
           google::protobuf::internal::GetOwnedMessageInternal
                     (message_arena,&blobfilevalue->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 5;
    (this->value_).blobfilevalue_ = blobfilevalue;
  }
  return;
}

Assistant:

void Value::set_allocated_blobfilevalue(::CoreML::Specification::MILSpec::Value_BlobFileValue* blobfilevalue) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (blobfilevalue) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::Value_BlobFileValue>::GetOwningArena(blobfilevalue);
    if (message_arena != submessage_arena) {
      blobfilevalue = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, blobfilevalue, submessage_arena);
    }
    set_has_blobfilevalue();
    value_.blobfilevalue_ = blobfilevalue;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.Value.blobFileValue)
}